

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O2

char * slurpfile(size_t *sizep,char *fmt,...)

{
  char in_AL;
  int iVar1;
  FILE *__stream;
  char *__ptr;
  size_t sVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  stat st;
  undefined1 local_20d8 [16];
  undefined8 local_20c8;
  undefined8 local_20c0;
  undefined8 local_20b8;
  undefined8 local_20b0;
  undefined8 local_20a8;
  undefined8 local_2098;
  undefined8 local_2088;
  undefined8 local_2078;
  undefined8 local_2068;
  undefined8 local_2058;
  undefined8 local_2048;
  undefined8 local_2038;
  char filename [8192];
  
  ap[0].reg_save_area = local_20d8;
  if (in_AL != '\0') {
    local_20a8 = in_XMM0_Qa;
    local_2098 = in_XMM1_Qa;
    local_2088 = in_XMM2_Qa;
    local_2078 = in_XMM3_Qa;
    local_2068 = in_XMM4_Qa;
    local_2058 = in_XMM5_Qa;
    local_2048 = in_XMM6_Qa;
    local_2038 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = &stack0x00000008;
  ap[0].gp_offset = 0x10;
  ap[0].fp_offset = 0x30;
  local_20c8 = in_RDX;
  local_20c0 = in_RCX;
  local_20b8 = in_R8;
  local_20b0 = in_R9;
  vsnprintf(filename,0x2000,fmt,ap);
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
LAB_001032b4:
    __ptr = (char *)0x0;
  }
  else {
    iVar1 = fileno(__stream);
    iVar1 = fstat(iVar1,(stat *)&st);
    if (iVar1 == 0) {
      __ptr = (char *)malloc(st.st_size + 1);
      if (__ptr == (char *)0x0) {
        __ptr = (char *)0x0;
        logprintf("Can\'t allocate %ld bytes of memory to read file %s\n",st.st_size,filename);
      }
      else {
        sVar2 = fread(__ptr,1,st.st_size,__stream);
        if ((long)sVar2 < st.st_size) {
          logprintf("Can\'t read file %s\n",filename);
          fclose(__stream);
          free(__ptr);
          goto LAB_001032b4;
        }
        __ptr[st.st_size] = '\0';
        if (sizep != (size_t *)0x0) {
          *sizep = st.st_size;
        }
      }
    }
    else {
      __ptr = (char *)0x0;
      logprintf("Can\'t stat file %s\n",filename);
    }
    fclose(__stream);
  }
  return __ptr;
}

Assistant:

char *
slurpfile(size_t * sizep, const char *fmt, ...)
{
	char filename[8192];
	struct stat st;
	va_list ap;
	char *p;
	ssize_t bytes_read;
	FILE *f;
	int r;

	va_start(ap, fmt);
	vsnprintf(filename, sizeof(filename), fmt, ap);
	va_end(ap);

	f = fopen(filename, "rb");
	if (f == NULL) {
		/* Note: No error; non-existent file is okay here. */
		return (NULL);
	}
	r = fstat(fileno(f), &st);
	if (r != 0) {
		logprintf("Can't stat file %s\n", filename);
		fclose(f);
		return (NULL);
	}
	p = malloc((size_t)st.st_size + 1);
	if (p == NULL) {
		logprintf("Can't allocate %ld bytes of memory to read file %s\n",
		    (long int)st.st_size, filename);
		fclose(f);
		return (NULL);
	}
	bytes_read = fread(p, 1, (size_t)st.st_size, f);
	if (bytes_read < st.st_size) {
		logprintf("Can't read file %s\n", filename);
		fclose(f);
		free(p);
		return (NULL);
	}
	p[st.st_size] = '\0';
	if (sizep != NULL)
		*sizep = (size_t)st.st_size;
	fclose(f);
	return (p);
}